

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_ffi_tapi.cpp
# Opt level: O0

void tqapi_tapi_free_query_result(TradeApi *tapi,QueryResult *result)

{
  QueryResultData *this;
  QueryResult *result_local;
  TradeApi *tapi_local;
  
  this = result->_data;
  if (this != (QueryResultData *)0x0) {
    QueryResultData::~QueryResultData(this);
    operator_delete(this);
  }
  if (result != (QueryResult *)0x0) {
    operator_delete(result);
  }
  return;
}

Assistant:

void tqapi_tapi_free_query_result (TradeApi* tapi, QueryResult * result)
    {
        delete result->_data;
        delete result;
    }